

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompose.cpp
# Opt level: O1

void test<double>(string *filename,vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,
                 int target_level)

{
  vector<double,_std::allocator<double>_> data;
  size_t num_elements;
  vector<double,_std::allocator<double>_> data_ori;
  vector<double,_std::allocator<double>_> local_50;
  size_t local_38;
  vector<double,_std::allocator<double>_> local_30;
  
  local_38 = 0;
  MGARD::readfile<double>(&local_50,(filename->_M_dataplus)._M_p,&local_38);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,&local_50);
  test_decompose<double>(&local_50,dims,target_level);
  test_recompose<double>(&local_50,dims,target_level);
  MGARD::print_statistics<double>
            (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,local_38);
  if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test(string filename, const vector<size_t>& dims, int target_level){
    size_t num_elements = 0;
    auto data = MGARD::readfile<T>(filename.c_str(), num_elements);
    auto data_ori(data);
    test_decompose(data, dims, target_level);
    test_recompose(data, dims, target_level);
    MGARD::print_statistics(data_ori.data(), data.data(), num_elements);
}